

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O3

Extra_MmFlex_t * Extra_MmFlexStart(void)

{
  Extra_MmFlex_t *pEVar1;
  char **ppcVar2;
  
  pEVar1 = (Extra_MmFlex_t *)calloc(1,0x38);
  pEVar1->nChunkSize = 0x1000;
  pEVar1->nChunksAlloc = 0x40;
  ppcVar2 = (char **)malloc(0x200);
  pEVar1->pChunks = ppcVar2;
  return pEVar1;
}

Assistant:

Extra_MmFlex_t * Extra_MmFlexStart()
{ 
    Extra_MmFlex_t * p;
//printf( "allocing flex\n" );
    p = ABC_ALLOC( Extra_MmFlex_t, 1 );
    memset( p, 0, sizeof(Extra_MmFlex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 12);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}